

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text-buffer.cc
# Opt level: O3

void __thiscall TextBuffer::reset(TextBuffer *this,Text *new_base_text)

{
  Layer **ppLVar1;
  anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
  *paVar2;
  Layer *pLVar3;
  pointer puVar4;
  pointer pcVar5;
  pointer puVar6;
  uint32_t uVar7;
  Layer *pLVar8;
  Point PVar9;
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> local_70;
  pointer local_50;
  pointer puStack_48;
  pointer local_40;
  bool local_38;
  
  ppLVar1 = &this->top_layer;
  pLVar8 = (Layer *)ppLVar1;
  do {
    pLVar8 = pLVar8->previous_layer;
    if (pLVar8 == (Layer *)0x0) {
      pLVar8 = (*ppLVar1)->previous_layer;
      while (pLVar8 != (Layer *)0x0) {
        pLVar3 = pLVar8->previous_layer;
        puVar4 = (pLVar8->text).value.line_offsets.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (puVar4 != (pointer)0x0) {
          operator_delete(puVar4,(long)*(pointer *)
                                        ((long)&(pLVar8->text).value.line_offsets.
                                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                ._M_impl + 0x10) - (long)puVar4);
        }
        pcVar5 = (pLVar8->text).value.content._M_dataplus._M_p;
        paVar2 = &(pLVar8->text).value.content.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
             *)pcVar5 != paVar2) {
          operator_delete(pcVar5,paVar2->_M_allocated_capacity * 2 + 2);
        }
        Patch::~Patch(&pLVar8->patch);
        operator_delete(pLVar8,0xa0);
        pLVar8 = pLVar3;
      }
      PVar9 = Text::extent(new_base_text);
      (*ppLVar1)->extent_ = PVar9;
      uVar7 = Text::size(new_base_text);
      (*ppLVar1)->size_ = uVar7;
      local_70._M_dataplus._M_p = (new_base_text->content)._M_dataplus._M_p;
      paVar2 = &(new_base_text->content).field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
           *)local_70._M_dataplus._M_p == paVar2) {
        local_70.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
        local_70.field_2._8_8_ = *(undefined8 *)((long)&(new_base_text->content).field_2 + 8);
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      }
      else {
        local_70.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
      }
      local_70._M_string_length = (new_base_text->content)._M_string_length;
      (new_base_text->content)._M_dataplus._M_p = (pointer)paVar2;
      (new_base_text->content)._M_string_length = 0;
      (new_base_text->content).field_2._M_local_buf[0] = L'\0';
      local_50 = (new_base_text->line_offsets).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start;
      puStack_48 = (new_base_text->line_offsets).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
      local_40 = (new_base_text->line_offsets).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
      (new_base_text->line_offsets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (new_base_text->line_offsets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (new_base_text->line_offsets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_38 = true;
      pLVar8 = *ppLVar1;
      std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::
      operator=((basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *)
                &pLVar8->text,&local_70);
      puVar4 = (pLVar8->text).value.line_offsets.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      puVar6 = *(pointer *)
                ((long)&(pLVar8->text).value.line_offsets.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data + 0x10);
      (pLVar8->text).value.line_offsets.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = local_50;
      *(pointer *)
       ((long)&(pLVar8->text).value.line_offsets.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data + 8) = puStack_48;
      *(pointer *)
       ((long)&(pLVar8->text).value.line_offsets.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data + 0x10) = local_40;
      local_50 = (pointer)0x0;
      puStack_48 = (pointer)0x0;
      local_40 = (pointer)0x0;
      if (puVar4 == (pointer)0x0) {
        (pLVar8->text).is_some = local_38;
      }
      else {
        operator_delete(puVar4,(long)puVar6 - (long)puVar4);
        (pLVar8->text).is_some = local_38;
        if (local_50 != (pointer)0x0) {
          operator_delete(local_50,(long)local_40 - (long)local_50);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity * 2 + 2);
      }
      Patch::clear(&this->top_layer->patch);
      pLVar8 = this->top_layer;
      pLVar8->uses_patch = false;
      this->base_layer = pLVar8;
      pLVar8->previous_layer = (Layer *)0x0;
      return;
    }
  } while (pLVar8->snapshot_count == 0);
  set_text(this,&new_base_text->content);
  flush_changes(this);
  return;
}

Assistant:

void TextBuffer::reset(Text &&new_base_text) {
  bool has_snapshot = false;
  auto layer = top_layer;
  while (layer) {
    if (layer->snapshot_count > 0) {
      has_snapshot = true;
      break;
    }
    layer = layer->previous_layer;
  }

  if (has_snapshot) {
    set_text(move(new_base_text.content));
    flush_changes();
    return;
  }

  layer = top_layer->previous_layer;
  while (layer) {
    Layer *previous_layer = layer->previous_layer;
    delete layer;
    layer = previous_layer;
  }

  top_layer->extent_ = new_base_text.extent();
  top_layer->size_ = new_base_text.size();
  top_layer->text = move(new_base_text);
  top_layer->patch.clear();
  top_layer->uses_patch = false;
  base_layer = top_layer;
  top_layer->previous_layer = nullptr;
}